

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_ggfload(jit_State *J,IRType t,uintptr_t ofs)

{
  TRef TVar1;
  ulong in_RDX;
  ushort in_SI;
  jit_State *in_RDI;
  
  (in_RDI->fold).ins.field_0.ot = in_SI | 0x4400;
  (in_RDI->fold).ins.field_0.op1 = 0x7fff;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)(in_RDX >> 2);
  TVar1 = lj_opt_fold(in_RDI);
  return TVar1;
}

Assistant:

LJ_FUNC TRef lj_ir_ggfload(jit_State *J, IRType t, uintptr_t ofs)
{
  lj_assertJ((ofs & 3) == 0, "unaligned GG_State field offset");
  ofs >>= 2;
  lj_assertJ(ofs >= IRFL__MAX && ofs <= 0x3ff,
	     "GG_State field offset breaks 10 bit FOLD key limit");
  lj_ir_set(J, IRT(IR_FLOAD, t), REF_NIL, ofs);
  return lj_opt_fold(J);
}